

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pageInsertArray(MemPage *pPg,u8 *pBegin,u8 **ppData,u8 *pCellptr,int iFirst,int nCell,
                   CellArray *pCArray)

{
  u8 *puVar1;
  u8 *__src;
  ulong uVar2;
  u8 *__dest;
  long lVar3;
  ulong uVar4;
  ushort uVar5;
  size_t __n;
  u8 *puVar6;
  long lVar7;
  int rc;
  int local_6c;
  u8 *local_68;
  int local_34;
  
  if (nCell < 1) {
    return 0;
  }
  puVar1 = pPg->aData;
  local_68 = *ppData;
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    if (5 < uVar4) break;
    uVar2 = uVar4 + 1;
  } while (pCArray->ixNx[uVar4] <= iFirst);
  local_6c = (int)(uVar4 + 1) + -1;
  puVar6 = pCArray->apEnd[uVar4];
  lVar3 = (long)iFirst;
  do {
    lVar7 = lVar3 + 1;
    uVar5 = pCArray->szCell[lVar3];
    __n = (size_t)uVar5;
    if ((puVar1[1] == '\0') && (puVar1[2] == '\0')) {
LAB_0014a5e9:
      if ((long)local_68 - (long)pBegin < (long)__n) {
        return 1;
      }
      __dest = local_68 + -__n;
      local_68 = __dest;
    }
    else {
      __dest = pageFindSlot(pPg,(uint)uVar5,&local_34);
      if (__dest == (u8 *)0x0) goto LAB_0014a5e9;
      __n = (size_t)(uint)uVar5;
    }
    __src = pCArray->apCell[lVar3];
    if ((__src < puVar6) && (puVar6 < __src + __n)) {
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12224,
                  "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
      return 1;
    }
    memmove(__dest,__src,__n);
    uVar5 = (short)__dest - (short)puVar1;
    *(ushort *)pCellptr = uVar5 * 0x100 | uVar5 >> 8;
    if (nCell + iFirst <= lVar7) {
      *ppData = local_68;
      return 0;
    }
    lVar3 = (long)local_6c;
    if (pCArray->ixNx[lVar3] <= lVar7) {
      local_6c = local_6c + 1;
      puVar6 = pCArray->apEnd[lVar3 + 1];
    }
    pCellptr = (u8 *)((long)pCellptr + 2);
    lVar3 = lVar7;
  } while( true );
}

Assistant:

static int pageInsertArray(
  MemPage *pPg,                   /* Page to add cells to */
  u8 *pBegin,                     /* End of cell-pointer array */
  u8 **ppData,                    /* IN/OUT: Page content-area pointer */
  u8 *pCellptr,                   /* Pointer to cell-pointer area */
  int iFirst,                     /* Index of first cell to add */
  int nCell,                      /* Number of cells to add to pPg */
  CellArray *pCArray              /* Array of cells */
){
  int i = iFirst;                 /* Loop counter - cell index to insert */
  u8 *aData = pPg->aData;         /* Complete page */
  u8 *pData = *ppData;            /* Content area.  A subset of aData[] */
  int iEnd = iFirst + nCell;      /* End of loop. One past last cell to ins */
  int k;                          /* Current slot in pCArray->apEnd[] */
  u8 *pEnd;                       /* Maximum extent of cell data */
  assert( CORRUPT_DB || pPg->hdrOffset==0 );    /* Never called on page 1 */
  if( iEnd<=iFirst ) return 0;
  for(k=0; pCArray->ixNx[k]<=i && ALWAYS(k<NB*2); k++){}
  pEnd = pCArray->apEnd[k];
  while( 1 /*Exit by break*/ ){
    int sz, rc;
    u8 *pSlot;
    assert( pCArray->szCell[i]!=0 );
    sz = pCArray->szCell[i];
    if( (aData[1]==0 && aData[2]==0) || (pSlot = pageFindSlot(pPg,sz,&rc))==0 ){
      if( (pData - pBegin)<sz ) return 1;
      pData -= sz;
      pSlot = pData;
    }
    /* pSlot and pCArray->apCell[i] will never overlap on a well-formed
    ** database.  But they might for a corrupt database.  Hence use memmove()
    ** since memcpy() sends SIGABORT with overlapping buffers on OpenBSD */
    assert( (pSlot+sz)<=pCArray->apCell[i]
         || pSlot>=(pCArray->apCell[i]+sz)
         || CORRUPT_DB );
    if( (uptr)(pCArray->apCell[i]+sz)>(uptr)pEnd
     && (uptr)(pCArray->apCell[i])<(uptr)pEnd
    ){
      assert( CORRUPT_DB );
      (void)SQLITE_CORRUPT_BKPT;
      return 1;
    }
    memmove(pSlot, pCArray->apCell[i], sz);
    put2byte(pCellptr, (pSlot - aData));
    pCellptr += 2;
    i++;
    if( i>=iEnd ) break;
    if( pCArray->ixNx[k]<=i ){
      k++;
      pEnd = pCArray->apEnd[k];
    }
  }
  *ppData = pData;
  return 0;
}